

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_int_scan.cpp
# Opt level: O0

LOs __thiscall Omega_h::offset_scan<int>(Omega_h *this,Read<int> *a,string *name)

{
  char *file;
  void *extraout_RDX;
  LOs LVar1;
  Write<int> local_1c0;
  int *local_1b0;
  int *local_1a8;
  int *local_1a0;
  int *result;
  CastIterator<int,_int> last;
  CastIterator<int,_int> first;
  Write<int> out;
  allocator local_141;
  string local_140 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100 [39];
  ScopedTimer local_d9;
  string *psStack_d8;
  ScopedTimer omega_h_scoped_function_timer;
  string *name_local;
  Read<int> *a_local;
  ulong local_58;
  ulong local_40;
  
  psStack_d8 = name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_140,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_int_scan.cpp"
             ,&local_141);
  std::operator+(local_120,(char *)local_140);
  std::__cxx11::to_string((__cxx11 *)&out.shared_alloc_.direct_ptr,0xc);
  std::operator+(local_100,local_120);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_d9,"offset_scan",file);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)&out.shared_alloc_.direct_ptr);
  std::__cxx11::string::~string((string *)local_120);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_40 = ((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_40 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
  }
  Write<int>::Write((Write<int> *)&first,(int)(local_40 >> 2) + 1,psStack_d8);
  Write<int>::set((Write<int> *)&first,0,0);
  local_1a8 = (int *)(a->write_).shared_alloc_.direct_ptr;
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_58 = ((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_58 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
  }
  local_1b0 = (int *)((long)(a->write_).shared_alloc_.direct_ptr + (long)(int)(local_58 >> 2) * 4);
  local_1a0 = (int *)((long)&(out.shared_alloc_.alloc)->size + 4);
  inclusive_scan<Omega_h::CastIterator<int,int>,int*>
            ((CastIterator<int,_int>)local_1a8,(CastIterator<int,_int>)local_1b0,local_1a0);
  Write<int>::Write(&local_1c0,(Write<int> *)&first);
  Read<int>::Read((Read<int> *)this,&local_1c0);
  Write<int>::~Write(&local_1c0);
  Write<int>::~Write((Write<int> *)&first);
  ScopedTimer::~ScopedTimer(&local_d9);
  LVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  LVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar1.write_.shared_alloc_;
}

Assistant:

LOs offset_scan(Read<T> a, std::string const& name) {
  OMEGA_H_TIME_FUNCTION;
  Write<LO> out(a.size() + 1, name);
  out.set(0, 0);
  auto const first = CastIterator<LO, T>(a.begin());
  auto const last = CastIterator<LO, T>(a.end());
  auto const result = out.begin() + 1;
  inclusive_scan(first, last, result);
  return out;
}